

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O0

sexp_conflict
sexp_thread_join(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict thread,
                sexp_conflict timeout)

{
  sexp_conflict psVar1;
  sexp in_RCX;
  undefined8 in_RSI;
  sexp_conflict in_RDI;
  sexp_conflict unaff_retaddr;
  sexp_conflict in_stack_fffffffffffffff8;
  
  if ((((ulong)in_RCX & 3) == 0) && (in_RCX->tag == 0x24)) {
    if ((in_RCX->value).context.refuel < 1) {
      psVar1 = (sexp_conflict)&DAT_0000013e;
    }
    else {
      (in_RDI->value).flonum_bits[0x60a2] = '\0';
      (in_RDI->value).flonum_bits[0x60a3] = '\x01';
      (in_RDI->value).opcode.dl = in_RCX;
      sexp_insert_timed(unaff_retaddr,in_stack_fffffffffffffff8,in_RDI);
      psVar1 = (sexp_conflict)0x3e;
    }
  }
  else {
    psVar1 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,0x24,in_RCX);
  }
  return psVar1;
}

Assistant:

sexp sexp_thread_join (sexp ctx, sexp self, sexp_sint_t n, sexp thread, sexp timeout) {
  sexp_assert_type(ctx, sexp_contextp, SEXP_CONTEXT, thread);
  if (sexp_context_refuel(thread) <= 0) /* return true if already terminated */ {
    return SEXP_TRUE;
  }
  sexp_context_timeoutp(ctx) = 0;
  sexp_context_waitp(ctx) = 1;
  sexp_context_event(ctx) = thread;
  sexp_insert_timed(ctx, ctx, timeout);
  return SEXP_FALSE;
}